

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O3

int CVodeSVtolerances(void *cvode_mem,realtype reltol,N_Vector abstol)

{
  long lVar1;
  N_Vector z;
  int iVar2;
  int error_code;
  char *msgfmt;
  realtype rVar3;
  undefined1 auVar4 [16];
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar2 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
  }
  else if (*(int *)((long)cvode_mem + 0x464) == 0) {
    msgfmt = "Attempt to call before CVodeInit.";
    iVar2 = -0x17;
    error_code = -0x17;
  }
  else {
    if (0.0 <= reltol) {
      if (abstol->ops->nvmin == (_func_realtype_N_Vector *)0x0) {
        msgfmt = "Missing N_VMin routine from N_Vector";
      }
      else {
        rVar3 = N_VMin(abstol);
        if (0.0 <= rVar3) {
          if (*(int *)((long)cvode_mem + 0x460) == 0) {
            z = N_VClone(*(N_Vector *)((long)cvode_mem + 200));
            *(N_Vector *)((long)cvode_mem + 0x38) = z;
            lVar1 = *(long *)((long)cvode_mem + 0x3b0);
            auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
            auVar4._0_8_ = lVar1;
            auVar4._12_4_ = -(uint)(lVar1 < 0);
            *(long *)((long)cvode_mem + 0x3b8) =
                 *(long *)((long)cvode_mem + 0x3b8) + CONCAT44(-(uint)((int)lVar1 < 0),(int)lVar1);
            *(long *)((long)cvode_mem + 0x3c0) = *(long *)((long)cvode_mem + 0x3c0) + auVar4._8_8_;
            *(undefined4 *)((long)cvode_mem + 0x460) = 1;
          }
          else {
            z = *(N_Vector *)((long)cvode_mem + 0x38);
          }
          *(realtype *)((long)cvode_mem + 0x28) = reltol;
          N_VScale(1.0,abstol,z);
          *(uint *)((long)cvode_mem + 0x40) = -(uint)(rVar3 == 0.0) & 1;
          *(undefined4 *)((long)cvode_mem + 0x24) = 2;
          *(undefined4 *)((long)cvode_mem + 0x44) = 0;
          *(code **)((long)cvode_mem + 0x48) = cvEwtSet;
          *(undefined8 *)((long)cvode_mem + 0x50) = 0;
          return 0;
        }
        msgfmt = "abstol has negative component(s) (illegal).";
      }
    }
    else {
      msgfmt = "reltol < 0 illegal.";
    }
    iVar2 = -0x16;
    error_code = -0x16;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSVtolerances",msgfmt);
  return iVar2;
}

Assistant:

int CVodeSVtolerances(void *cvode_mem, realtype reltol, N_Vector abstol)
{
  CVodeMem cv_mem;
  realtype atolmin;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSVtolerances",
                   MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }
  cv_mem = (CVodeMem) cvode_mem;

  if (cv_mem->cv_MallocDone == SUNFALSE) {
    cvProcessError(cv_mem, CV_NO_MALLOC, "CVODE", "CVodeSVtolerances",
                   MSGCV_NO_MALLOC);
    return(CV_NO_MALLOC);
  }

  /* Check inputs */

  if (reltol < ZERO) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSVtolerances",
                   MSGCV_BAD_RELTOL);
    return(CV_ILL_INPUT);
  }

  if (abstol->ops->nvmin == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSVtolerances",
                   "Missing N_VMin routine from N_Vector");
    return(CV_ILL_INPUT);
  }
  atolmin = N_VMin(abstol);
  if (atolmin < ZERO) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSVtolerances",
                   MSGCV_BAD_ABSTOL);
    return(CV_ILL_INPUT);
  }

  /* Copy tolerances into memory */

  if ( !(cv_mem->cv_VabstolMallocDone) ) {
    cv_mem->cv_Vabstol = N_VClone(cv_mem->cv_ewt);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_VabstolMallocDone = SUNTRUE;
  }

  cv_mem->cv_reltol = reltol;
  N_VScale(ONE, abstol, cv_mem->cv_Vabstol);
  cv_mem->cv_atolmin0 = (atolmin == ZERO);

  cv_mem->cv_itol = CV_SV;

  cv_mem->cv_user_efun = SUNFALSE;
  cv_mem->cv_efun = cvEwtSet;
  cv_mem->cv_e_data = NULL; /* will be set to cvode_mem in InitialSetup */

  return(CV_SUCCESS);
}